

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneCommand(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  string cname;
  
  this_00 = (cmDocumentation *)&stack0xffffffffffffffa8;
  cmsys::SystemTools::LowerCase((string *)&stack0xffffffffffffffc8,&this->CurrentArgument);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa8,"command/",(string *)&stack0xffffffffffffffc8);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    poVar2 = std::operator<<(poVar2,"\" to --help-command is not a CMake command.  ");
    std::operator<<(poVar2,"Use --help-command-list to see all commands.\n");
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneCommand(std::ostream& os)
{
  std::string cname = cmSystemTools::LowerCase(this->CurrentArgument);
  if(this->PrintFiles(os, "command/" + cname))
    {
    return true;
    }
  // Argument was not a command.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-command is not a CMake command.  "
     << "Use --help-command-list to see all commands.\n";
  return false;
}